

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O1

void __thiscall t_lua_generator::generate_enum(t_lua_generator *this,t_enum *tenum)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  ofstream_with_content_based_conditional_update *poVar3;
  pointer pptVar4;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_48;
  
  poVar3 = &this->f_types_;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar3,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar1 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)CONCAT44(extraout_var,iVar1),
                      ((undefined8 *)CONCAT44(extraout_var,iVar1))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = {",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector(&local_48,&tenum->constants_)
  ;
  pptVar4 = local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (pptVar4 !=
         local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    iVar1 = (*pptVar4)->value_;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"  ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar3,((*pptVar4)->name_)._M_dataplus._M_p,
                        ((*pptVar4)->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    std::ostream::operator<<(poVar2,iVar1);
    pptVar4 = pptVar4 + 1;
    if (pptVar4 !=
        local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,",",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"}",1);
  if (local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_lua_generator::generate_enum(t_enum* tenum) {
  f_types_ << endl << endl << tenum->get_name() << " = {" << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end();) {
    int32_t value = (*c_iter)->get_value();

    f_types_ << "  " << (*c_iter)->get_name() << " = " << value;
    ++c_iter;
    if (c_iter != constants.end()) {
      f_types_ << ",";
    }
    f_types_ << endl;
  }
  f_types_ << "}";
}